

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O3

void duckdb_je_edata_cache_fast_disable(tsdn_t *tsdn,edata_cache_fast_t *ecs)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  atomic_zu_t *paVar3;
  edata_cache_t *peVar4;
  edata_t *peVar5;
  int iVar6;
  edata_t *phn;
  long lVar7;
  
  peVar4 = ecs->fallback;
  iVar6 = pthread_mutex_trylock((pthread_mutex_t *)((long)&(peVar4->mtx).field_0 + 0x48));
  if (iVar6 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&peVar4->mtx);
    (peVar4->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(peVar4->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((peVar4->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (peVar4->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(peVar4->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  lVar7 = 0;
  phn = (ecs->list).head.qlh_first;
  while (phn != (edata_t *)0x0) {
    peVar5 = (phn->field_6).ql_link_inactive.qre_next;
    (ecs->list).head.qlh_first = peVar5;
    if (peVar5 == phn) {
      (ecs->list).head.qlh_first = (edata_t *)0x0;
    }
    else {
      (((phn->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
           (peVar5->field_6).ql_link_inactive.qre_prev;
      peVar5 = (phn->field_6).ql_link_inactive.qre_prev;
      (((phn->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev = peVar5;
      (phn->field_6).ql_link_inactive.qre_prev = (peVar5->field_6).ql_link_inactive.qre_next;
      peVar5 = (phn->field_6).ql_link_inactive.qre_next;
      (((peVar5->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar5;
      (((phn->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = phn;
    }
    duckdb_je_edata_avail_insert(&ecs->fallback->avail,phn);
    lVar7 = lVar7 + 1;
    phn = (ecs->list).head.qlh_first;
  }
  paVar3 = &ecs->fallback->count;
  paVar3->repr = paVar3->repr + lVar7;
  peVar4 = ecs->fallback;
  (peVar4->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(peVar4->mtx).field_0 + 0x48));
  ecs->disabled = true;
  return;
}

Assistant:

void
edata_cache_fast_disable(tsdn_t *tsdn, edata_cache_fast_t *ecs) {
	edata_cache_fast_flush_all(tsdn, ecs);
	ecs->disabled = true;
}